

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeFunction(ValueBuilder *this,IString name)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_28;
  undefined1 local_20 [8];
  IString name_local;
  
  name_local.str._M_len = name.str._M_len;
  local_20 = (undefined1  [8])this;
  local_28 = makeRawArray(4);
  pVVar1 = Ref::operator->(&local_28);
  RVar2 = makeRawString((IString *)DEFUN);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawString((IString *)local_20);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawArray(0);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawArray(0);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  Ref::Ref((Ref *)&name_local.str._M_str,pVVar1);
  return (Ref)(Value *)name_local.str._M_str;
}

Assistant:

static Ref makeFunction(IString name) {
    return &makeRawArray(4)
              ->push_back(makeRawString(DEFUN))
              .push_back(makeRawString(name))
              .push_back(makeRawArray())
              .push_back(makeRawArray());
  }